

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O2

void idle_2_cb(uv_idle_t *handle)

{
  fputs("IDLE_2_CB\n",_stderr);
  fflush(_stderr);
  if (handle == &idle_2_handle) {
    idle_2_cb_called = idle_2_cb_called + 1;
    uv_close((uv_handle_t *)&idle_2_handle,idle_2_close_cb);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
          ,0x84,"handle == &idle_2_handle");
  abort();
}

Assistant:

static void idle_2_cb(uv_idle_t* handle) {
  fprintf(stderr, "%s", "IDLE_2_CB\n");
  fflush(stderr);

  ASSERT(handle == &idle_2_handle);

  idle_2_cb_called++;

  uv_close((uv_handle_t*)handle, idle_2_close_cb);
}